

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O3

void __thiscall gimage::PNGImageIO::save(PNGImageIO *this,ImageU16 *image,char *name)

{
  size_type *psVar1;
  png_charp *ppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  FILE *__stream;
  __jmp_buf_tag *__env;
  undefined8 *puVar5;
  char *pcVar6;
  void *pvVar7;
  long lVar8;
  long *plVar9;
  IOException *pIVar10;
  long *plVar11;
  void *pvVar12;
  long lVar13;
  png_charp pcVar14;
  ulong uVar15;
  undefined8 uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  png_structp png;
  png_infop info;
  string tm;
  string vs;
  png_text text [2];
  time_t tt;
  
  iVar4 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar4 == '\0') || ((image->depth | 2U) != 3)) {
    pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&tm,name,(allocator *)&png);
    std::operator+(&vs,"Can only save PNG images with depth 1 or 3 (",&tm);
    plVar11 = (long *)std::__cxx11::string::append((char *)&vs);
    text[0]._0_8_ = *plVar11;
    plVar9 = plVar11 + 2;
    if ((long *)text[0]._0_8_ == plVar9) {
      text[0].text = (png_charp)*plVar9;
      text[0].text_length = plVar11[3];
      text[0]._0_8_ = &text[0].text;
    }
    else {
      text[0].text = (png_charp)*plVar9;
    }
    text[0].key = (png_charp)plVar11[1];
    *plVar11 = (long)plVar9;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    gutil::IOException::IOException(pIVar10,(string *)text);
    __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"wb");
  if (__stream == (FILE *)0x0) {
    pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&tm,name,(allocator *)&png);
    std::operator+(&vs,"Cannot open file (",&tm);
    plVar11 = (long *)std::__cxx11::string::append((char *)&vs);
    text[0]._0_8_ = *plVar11;
    plVar9 = plVar11 + 2;
    if ((long *)text[0]._0_8_ == plVar9) {
      text[0].text = (png_charp)*plVar9;
      text[0].text_length = plVar11[3];
      text[0]._0_8_ = &text[0].text;
    }
    else {
      text[0].text = (png_charp)*plVar9;
    }
    text[0].key = (png_charp)plVar11[1];
    *plVar11 = (long)plVar9;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    gutil::IOException::IOException(pIVar10,(string *)text);
    __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png = (png_structp)png_create_write_struct("1.6.37",0,0);
  if (png == (png_structp)0x0) {
    fclose(__stream);
    pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
    text[0]._0_8_ = &text[0].text;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)text,"Cannot allocate handle for writing PNG files","");
    gutil::IOException::IOException(pIVar10,(string *)text);
    __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  info = (png_infop)png_create_info_struct(png);
  if (info == (png_infop)0x0) {
    png_destroy_write_struct(&png,0);
    fclose(__stream);
    pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
    text[0]._0_8_ = &text[0].text;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)text,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar10,(string *)text);
    __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
  iVar4 = _setjmp(__env);
  if (iVar4 != 0) {
    png_destroy_write_struct(&png,&info);
    fclose(__stream);
    pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&tm,name,(allocator *)&tt);
    std::operator+(&vs,"Cannot read PNG file (",&tm);
    plVar11 = (long *)std::__cxx11::string::append((char *)&vs);
    text[0]._0_8_ = *plVar11;
    plVar9 = plVar11 + 2;
    if ((long *)text[0]._0_8_ == plVar9) {
      text[0].text = (png_charp)*plVar9;
      text[0].text_length = plVar11[3];
      text[0]._0_8_ = &text[0].text;
    }
    else {
      text[0].text = (png_charp)*plVar9;
    }
    text[0].key = (png_charp)plVar11[1];
    *plVar11 = (long)plVar9;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    gutil::IOException::IOException(pIVar10,(string *)text);
    __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png_init_io(png,__stream);
  png_set_IHDR(png,info,(int)image->width,(int)image->height,0x10,(image->depth == 3) * '\x02',0,0,0
              );
  ppcVar2 = &text[0].text;
  text[0]._0_8_ = ppcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)text,"cvkit version ","");
  paVar3 = &tm.field_2;
  tm._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tm,"2.6.17","");
  pcVar14 = (png_charp)0xf;
  if ((png_charp *)text[0]._0_8_ != ppcVar2) {
    pcVar14 = text[0].text;
  }
  if (pcVar14 < text[0].key + tm._M_string_length) {
    uVar16 = (png_charp)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tm._M_dataplus._M_p != paVar3) {
      uVar16 = tm.field_2._M_allocated_capacity;
    }
    if (text[0].key + tm._M_string_length <= (ulong)uVar16) {
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&tm,0,(char *)0x0,text[0]._0_8_);
      goto LAB_00142e7b;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)text,(ulong)tm._M_dataplus._M_p);
LAB_00142e7b:
  vs._M_dataplus._M_p = (pointer)&vs.field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    vs.field_2._M_allocated_capacity = *psVar1;
    vs.field_2._8_8_ = puVar5[3];
  }
  else {
    vs.field_2._M_allocated_capacity = *psVar1;
    vs._M_dataplus._M_p = (pointer)*puVar5;
  }
  vs._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(char *)psVar1 = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tm._M_dataplus._M_p != paVar3) {
    operator_delete(tm._M_dataplus._M_p);
  }
  if ((png_charp *)text[0]._0_8_ != ppcVar2) {
    operator_delete((void *)text[0]._0_8_);
  }
  tt = time((time_t *)0x0);
  pcVar6 = ctime(&tt);
  std::__cxx11::string::string((string *)&tm,pcVar6,(allocator *)text);
  text[0].text_length = 0;
  text[1].lang = (png_charp)0x0;
  text[1].lang_key = (png_charp)0x0;
  text[1].text_length = 0;
  text[1].itxt_length = 0;
  text[1].key = (png_charp)0x0;
  text[1].text = (png_charp)0x0;
  text[0].lang_key = (png_charp)0x0;
  text[1].compression = 0;
  text[1]._4_4_ = 0;
  text[0].itxt_length = 0;
  text[0].lang = (png_charp)0x0;
  text[0].compression = -1;
  text[0]._4_4_ = 0;
  text[0].key = "Software";
  text[0].text = vs._M_dataplus._M_p;
  text[0].text_length = strlen(vs._M_dataplus._M_p);
  text[1].compression = -1;
  text[1].key = "Creation Time";
  text[1].text = tm._M_dataplus._M_p;
  text[1].text_length = strlen(tm._M_dataplus._M_p);
  png_set_text(png,info,text,2);
  png_write_info(png,info);
  uVar15 = (long)image->depth * image->width * 2;
  uVar17 = 0xffffffffffffffff;
  if (-1 < (long)uVar15) {
    uVar17 = uVar15;
  }
  pvVar7 = operator_new__(uVar17);
  if (0 < image->height) {
    lVar8 = 0;
    do {
      lVar19 = image->width;
      if (0 < lVar19) {
        uVar15 = (ulong)(uint)image->depth;
        lVar18 = 0;
        pvVar12 = pvVar7;
        do {
          if (0 < (int)uVar15) {
            lVar13 = 0;
            lVar19 = lVar13;
            do {
              *(undefined1 *)((long)pvVar12 + lVar19 * 2) =
                   *(undefined1 *)((long)image->img[lVar19][lVar8] + lVar18 * 2 + 1);
              *(char *)((long)pvVar12 + lVar19 * 2 + 1) = (char)image->img[lVar19][lVar8][lVar18];
              lVar19 = lVar19 + 1;
              uVar15 = (ulong)image->depth;
              lVar13 = lVar13 + 2;
            } while (lVar19 < (long)uVar15);
            lVar19 = image->width;
            pvVar12 = (void *)((long)pvVar12 + lVar13);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < lVar19);
      }
      png_write_row(png,pvVar7);
      lVar8 = lVar8 + 1;
    } while (lVar8 < image->height);
  }
  png_write_end(png,info);
  operator_delete__(pvVar7);
  fclose(__stream);
  png_destroy_write_struct(&png,&info);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tm._M_dataplus._M_p != paVar3) {
    operator_delete(tm._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs._M_dataplus._M_p != &vs.field_2) {
    operator_delete(vs._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PNGImageIO::save(const ImageU16 &image, const char *name) const
{
  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNG images with depth 1 or 3 ("+std::string(name)+")");
  }

  // initialize writing a png file

  FILE *out=fopen(name, "wb");

  if (out == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(out);
    throw gutil::IOException("Cannot allocate handle for writing PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_write_struct(&png, static_cast<png_infopp>(0));
    fclose(out);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] row;

    png_destroy_write_struct(&png, &info);
    fclose(out);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // write header

  png_init_io(png, out);

  int color=PNG_COLOR_TYPE_GRAY;

  if (image.getDepth() == 3)
  {
    color=PNG_COLOR_TYPE_RGB;
  }

  png_set_IHDR(png, info, image.getWidth(), image.getHeight(), 16, color,
               PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
               PNG_FILTER_TYPE_DEFAULT);

  std::string vs=std::string("cvkit version ")+std::string(VERSION);

  time_t tt=time(0);
  std::string tm=ctime(&tt);

  png_text text[2];
  memset(text, 0, 2*sizeof(png_text));

  text[0].compression=PNG_TEXT_COMPRESSION_NONE;
  text[0].key=const_cast<char *>("Software");
  text[0].text=const_cast<char *>(vs.c_str());
  text[0].text_length=strlen(text[0].text);

  text[1].compression=PNG_TEXT_COMPRESSION_NONE;
  text[1].key=const_cast<char *>("Creation Time");
  text[1].text=const_cast<char *>(tm.c_str());
  text[1].text_length=strlen(text[1].text);

  png_set_text(png, info, text, 2);

  png_write_info(png, info);

  // write image

  row=new unsigned char [2*image.getDepth()*image.getWidth()];

  // write image content line by line

  for (long k=0; k<image.getHeight(); k++)
  {
    unsigned char *rp=row;

    for (long i=0; i<image.getWidth(); i++)
    {
      for (int j=0; j<image.getDepth(); j++)
      {
        *rp++=static_cast<unsigned char>(image.get(i, k, j)>>8);
        *rp++=static_cast<unsigned char>(image.get(i, k, j)&0xff);
      }
    }

    png_write_row(png, row);
  }

  // finish writing and close file

  png_write_end(png, info);

  delete [] row;

  fclose(out);

  png_destroy_write_struct(&png, &info);
}